

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O1

void __thiscall cppurses::Terminal::ncurses_set_palette(Terminal *this,Palette *colors)

{
  short sVar1;
  char cVar2;
  long lVar3;
  
  if ((this->is_initialized_ == true) && (cVar2 = can_change_color(), cVar2 != '\0')) {
    lVar3 = 0;
    do {
      sVar1 = *(short *)((long)&colors->_M_elems[0].color + lVar3);
      if ((int)sVar1 < (int)((uint)(byte)(0xf < _COLORS & this->is_initialized_) * 8 + 8)) {
        init_color((int)sVar1,
                   (int)(short)(int)(((double)(int)*(short *)((long)&colors->_M_elems[0].values.red
                                                             + lVar3) / 255.0) * 1000.0),
                   (int)(short)(int)(((double)(int)*(short *)((long)&colors->_M_elems[0].values.
                                                                     green + lVar3) / 255.0) *
                                    1000.0),
                   (int)(short)(int)(((double)(int)*(short *)((long)&colors->_M_elems[0].values.blue
                                                             + lVar3) / 255.0) * 1000.0));
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x80);
  }
  return;
}

Assistant:

bool Terminal::can_change_colors() const
{
    if (is_initialized_)
        return ::can_change_color() == TRUE;
    return false;
}